

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O0

void __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
dealloc_local_object_meta
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          PagemapEntry *entry,BackendSlabMetadata *meta)

{
  FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
  *this_00;
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t *puVar4;
  bool *pbVar5;
  uint64_t uVar6;
  FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
  *in_RDX;
  char *in_RSI;
  Ticker<snmalloc::PALLinux> *in_RDI;
  smallsizeclass_t sizeclass;
  Node *n;
  uint16_t allocated;
  size_t in_stack_ffffffffffffff28;
  smallsizeclass_t in_stack_ffffffffffffff30;
  smallsizeclass_t in_stack_ffffffffffffff48;
  Ticker<snmalloc::PALLinux> *this_01;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *in_stack_ffffffffffffff50;
  sizeclass_t local_a0;
  smallsizeclass_t local_98;
  FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
  *local_90;
  size_t local_70;
  Node *local_60;
  FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
  *local_58;
  Ticker<snmalloc::PALLinux> *local_50;
  uint16_t local_42;
  smallsizeclass_t local_40;
  FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
  *local_38;
  undefined8 local_30;
  Ticker<snmalloc::PALLinux> *local_28;
  undefined8 local_18;
  Ticker<snmalloc::PALLinux> *local_10;
  
  local_90 = in_RDX;
  local_a0 = sizeclass_t::from_raw(in_stack_ffffffffffffff28);
  local_70 = local_a0.value;
  local_98 = sizeclass_t::as_small(&local_a0);
  bVar1 = FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
          ::is_sleeping((FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                         *)0x11c2ce);
  this_00 = local_90;
  if (bVar1) {
    local_38 = local_90;
    local_40 = local_98;
    uVar2 = sizeclass_to_slab_object_count(in_stack_ffffffffffffff30);
    local_42 = uVar2;
    uVar3 = threshold_for_waking_slab(in_stack_ffffffffffffff30);
    puVar4 = FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
             ::needed(this_00);
    *puVar4 = uVar2 - uVar3;
    pbVar5 = FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
             ::sleeping(this_00);
    *pbVar5 = false;
    SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>::Node::remove
              (&local_90->node,in_RSI);
    this_01 = in_RDI + local_98 + 0x125;
    local_58 = local_90;
    local_50 = this_01;
    local_60 = SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>::get_node
                         ((SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                           *)this_01,
                          (DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider> *)local_90);
    local_60->next = (Node *)this_01->count_down;
    ((Node *)this_01->count_down)->prev = local_60;
    local_60->prev = (Node *)this_01;
    this_01->count_down = (uint64_t)local_60;
    SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>::Node::invariant
              (local_60);
    SeqSet<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>::Node::invariant
              ((Node *)this_01);
    *(short *)((long)&in_RDI[local_98 + 0x125].last_query_ms + 2) =
         *(short *)((long)&in_RDI[local_98 + 0x125].last_query_ms + 2) + 1;
    local_10 = in_RDI + 0x178;
    local_18 = 0;
    uVar6 = local_10->count_down - 1;
    local_10->count_down = uVar6;
    if (uVar6 == 0) {
      Ticker<snmalloc::PALLinux>::check_tick_slow<void*>(in_RDI,local_10);
    }
  }
  else {
    *(short *)&in_RDI[local_98 + 0x125].last_query_ms =
         (short)in_RDI[local_98 + 0x125].last_query_ms + 1;
    if ((2 < (ushort)in_RDI[local_98 + 0x125].last_query_ms) &&
       ((uint)((int)(uint)*(ushort *)((long)&in_RDI[local_98 + 0x125].last_query_ms + 2) >> 2) <
        (uint)(ushort)in_RDI[local_98 + 0x125].last_query_ms)) {
      dealloc_local_slabs<false>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    local_28 = in_RDI + 0x178;
    local_30 = 0;
    uVar6 = local_28->count_down - 1;
    local_28->count_down = uVar6;
    if (uVar6 == 0) {
      Ticker<snmalloc::PALLinux>::check_tick_slow<void*>(in_RDI,in_stack_ffffffffffffff50);
    }
  }
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void dealloc_local_object_meta(
      const PagemapEntry& entry, BackendSlabMetadata* meta)
    {
      smallsizeclass_t sizeclass = entry.get_sizeclass().as_small();

      if (meta->is_sleeping())
      {
        // Slab has been woken up add this to the list of slabs with free space.

        //  Wake slab up.
        meta->set_not_sleeping(sizeclass);

        // Remove from set of fully used slabs.
        meta->node.remove();

        alloc_classes[sizeclass].available.insert(meta);
        alloc_classes[sizeclass].length++;

#ifdef SNMALLOC_TRACING
        message<1024>("Slab is woken up");
#endif

        ticker.check_tick();
        return;
      }

      alloc_classes[sizeclass].unused++;

      // If we have several slabs, and it isn't too expensive as a proportion
      // return to the global pool.
      if (
        (alloc_classes[sizeclass].unused > 2) &&
        (alloc_classes[sizeclass].unused >
         (alloc_classes[sizeclass].length >> 2)))
      {
        dealloc_local_slabs(sizeclass);
      }
      ticker.check_tick();
    }